

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

char * read_referenced_name
                 (dwarf_data *ddata,unit *u,uint64_t offset,backtrace_error_callback error_callback,
                 void *data)

{
  dwarf_sections *dwarf_sections;
  int iVar1;
  uint64_t code;
  abbrev *paVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_168 [8];
  char b [200];
  dwarf_buf unit_buf;
  char *s;
  char *local_40;
  char *ret;
  
  uVar4 = offset - u->unit_data_offset;
  if ((offset < u->unit_data_offset) ||
     (unit_buf.buf = (uchar *)(u->unit_data_len - uVar4),
     u->unit_data_len < uVar4 || unit_buf.buf == (uchar *)0x0)) {
    (*error_callback)(data,"abstract origin or specification out of range",0);
    local_40 = (char *)0x0;
  }
  else {
    b._192_8_ = anon_var_dwarf_5e8f7;
    unit_buf.name = (char *)(ddata->dwarf_sections).data[0];
    unit_buf.start = u->unit_data + uVar4;
    unit_buf.left._0_4_ = ddata->is_bigendian;
    unit_buf.data._0_4_ = 0;
    unit_buf._32_8_ = error_callback;
    unit_buf.error_callback = (backtrace_error_callback)data;
    code = read_uleb128((dwarf_buf *)(b + 0xc0));
    if (code == 0) {
      snprintf(local_168,200,"%s in %s at %d","invalid abstract origin or specification",b._192_8_,
               (ulong)(uint)((int)unit_buf.start - (int)unit_buf.name));
      (*(code *)unit_buf._32_8_)(unit_buf.error_callback,local_168,0);
      local_40 = (char *)0x0;
    }
    else {
      paVar2 = lookup_abbrev(&u->abbrevs,code,error_callback,data);
      if ((paVar2 == (abbrev *)0x0) || (local_40 = (char *)0x0, paVar2->num_attrs == 0)) {
LAB_0012c6a0:
        local_40 = (char *)0x0;
      }
      else {
        dwarf_sections = &ddata->dwarf_sections;
        lVar5 = 0;
        uVar4 = 0;
        ret = (char *)ddata;
        do {
          iVar1 = read_attribute(*(dwarf_form *)((long)&paVar2->attrs->form + lVar5),
                                 *(uint64_t *)((long)&paVar2->attrs->val + lVar5),
                                 (dwarf_buf *)(b + 0xc0),u->is_dwarf64,u->version,u->addrsize,
                                 dwarf_sections,*(dwarf_data **)(ret + 8),(attr_val *)local_168);
          if (iVar1 == 0) goto LAB_0012c6a0;
          iVar1 = *(int *)((long)&paVar2->attrs->name + lVar5);
          if (iVar1 < 0x6e) {
            if (iVar1 == 3) {
              if ((local_40 == (char *)0x0) &&
                 (iVar1 = resolve_string(dwarf_sections,u->is_dwarf64,*(int *)(ret + 200),
                                         u->str_offsets_base,(attr_val *)local_168,error_callback,
                                         data,&local_40), iVar1 == 0)) goto LAB_0012c6a0;
            }
            else if ((iVar1 == 0x47) &&
                    (pcVar3 = read_referenced_name_from_attr
                                        ((dwarf_data *)ret,u,
                                         (attr *)((long)&paVar2->attrs->name + lVar5),
                                         (attr_val *)local_168,error_callback,data),
                    pcVar3 != (char *)0x0)) {
              local_40 = pcVar3;
            }
          }
          else if ((iVar1 == 0x6e) || (iVar1 == 0x2007)) {
            unit_buf.reported_underflow = 0;
            unit_buf._60_4_ = 0;
            iVar1 = resolve_string(dwarf_sections,u->is_dwarf64,*(int *)(ret + 200),
                                   u->str_offsets_base,(attr_val *)local_168,error_callback,data,
                                   (char **)&unit_buf.reported_underflow);
            if (iVar1 == 0) goto LAB_0012c6a0;
            if (unit_buf._56_8_ != 0) {
              return (char *)unit_buf._56_8_;
            }
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar4 < paVar2->num_attrs);
      }
    }
  }
  return local_40;
}

Assistant:

static const char *
read_referenced_name (struct dwarf_data *ddata, struct unit *u,
		      uint64_t offset, backtrace_error_callback error_callback,
		      void *data)
{
  struct dwarf_buf unit_buf;
  uint64_t code;
  const struct abbrev *abbrev;
  const char *ret;
  size_t i;

  /* OFFSET is from the start of the data for this compilation unit.
     U->unit_data is the data, but it starts U->unit_data_offset bytes
     from the beginning.  */

  if (offset < u->unit_data_offset
      || offset - u->unit_data_offset >= u->unit_data_len)
    {
      error_callback (data,
		      "abstract origin or specification out of range",
		      0);
      return NULL;
    }

  offset -= u->unit_data_offset;

  unit_buf.name = ".debug_info";
  unit_buf.start = ddata->dwarf_sections.data[DEBUG_INFO];
  unit_buf.buf = u->unit_data + offset;
  unit_buf.left = u->unit_data_len - offset;
  unit_buf.is_bigendian = ddata->is_bigendian;
  unit_buf.error_callback = error_callback;
  unit_buf.data = data;
  unit_buf.reported_underflow = 0;

  code = read_uleb128 (&unit_buf);
  if (code == 0)
    {
      dwarf_buf_error (&unit_buf,
		       "invalid abstract origin or specification",
		       0);
      return NULL;
    }

  abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
  if (abbrev == NULL)
    return NULL;

  ret = NULL;
  for (i = 0; i < abbrev->num_attrs; ++i)
    {
      struct attr_val val;

      if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			   &unit_buf, u->is_dwarf64, u->version, u->addrsize,
			   &ddata->dwarf_sections, ddata->altlink, &val))
	return NULL;

      switch (abbrev->attrs[i].name)
	{
	case DW_AT_name:
	  /* Third name preference: don't override.  A name we found in some
	     other way, will normally be more useful -- e.g., this name is
	     normally not mangled.  */
	  if (ret != NULL)
	    break;
	  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
			       ddata->is_bigendian, u->str_offsets_base,
			       &val, error_callback, data, &ret))
	    return NULL;
	  break;

	case DW_AT_linkage_name:
	case DW_AT_MIPS_linkage_name:
	  /* First name preference: override all.  */
	  {
	    const char *s;

	    s = NULL;
	    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				 ddata->is_bigendian, u->str_offsets_base,
				 &val, error_callback, data, &s))
	      return NULL;
	    if (s != NULL)
	      return s;
	  }
	  break;

	case DW_AT_specification:
	  /* Second name preference: override DW_AT_name, don't override
	     DW_AT_linkage_name.  */
	  {
	    const char *name;

	    name = read_referenced_name_from_attr (ddata, u, &abbrev->attrs[i],
						   &val, error_callback, data);
	    if (name != NULL)
	      ret = name;
	  }
	  break;

	default:
	  break;
	}
    }

  return ret;
}